

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O3

void producerThread(void *arg)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  deRandom random;
  deRandom dStack_38;
  
  deRandom_init(&dStack_38,0x7b);
  iVar4 = 0;
  iVar5 = 0x2711;
  do {
    uVar3 = 0;
    if (iVar5 != 1) {
      dVar1 = deRandom_getUint32(&dStack_38);
      uVar3 = dVar1 + (dVar1 == 0);
    }
    deSemaphore_decrement(*(deSemaphore *)((long)arg + 0x80));
    *(uint *)((long)arg + (long)iVar4 * 4) = uVar3;
    uVar2 = iVar4 + 0x20;
    if (-1 < (int)(iVar4 + 1U)) {
      uVar2 = iVar4 + 1U;
    }
    iVar4 = (iVar4 - (uVar2 & 0xffffffe0)) + 1;
    deSemaphore_increment(*(deSemaphore *)((long)arg + 0x88));
    *(uint *)((long)arg + 0x90) = *(uint *)((long)arg + 0x90) ^ uVar3;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void producerThread (void* arg)
{
	TestBuffer* buffer = (TestBuffer*)arg;
	deRandom	random;
	int			ndx;
	int			numToProduce	= 10000;
	int			writePos		= 0;

	deRandom_init(&random, 123);

	for (ndx = 0; ndx <= numToProduce; ndx++)
	{
		deUint32 val;

		if (ndx == numToProduce)
		{
			val = 0u; /* End. */
		}
		else
		{
			val = deRandom_getUint32(&random);
			val = val ? val : 1u;
		}

		deSemaphore_decrement(buffer->empty);

		buffer->buffer[writePos] = val;
		writePos = (writePos + 1) % DE_LENGTH_OF_ARRAY(buffer->buffer);

		deSemaphore_increment(buffer->fill);

		buffer->producerHash ^= val;
	}
}